

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O2

void us_internal_timer_sweep(us_loop_t *loop)

{
  us_socket_context_t *puVar1;
  unsigned_short uVar2;
  us_socket_context_t **ppuVar3;
  us_socket_t *puVar4;
  us_socket_t *puVar5;
  us_socket_t *s;
  us_socket_context_t *context;
  
  ppuVar3 = &(loop->data).head;
LAB_0010524a:
  puVar1 = *ppuVar3;
  (loop->data).iterator = puVar1;
  if (puVar1 == (us_socket_context_t *)0x0) {
    return;
  }
  puVar4 = puVar1->head;
  do {
    puVar1->iterator = puVar4;
    do {
      puVar5 = puVar4;
      if (puVar5 == (us_socket_t *)0x0) {
        ppuVar3 = &((loop->data).iterator)->next;
        goto LAB_0010524a;
      }
      if ((puVar5->timeout == 0) ||
         (uVar2 = puVar5->timeout - 1, puVar5->timeout = uVar2, uVar2 != 0)) break;
      (*puVar1->on_socket_timeout)(puVar5);
      puVar4 = puVar1->iterator;
    } while (puVar5 != puVar1->iterator);
    puVar4 = puVar5->next;
  } while( true );
}

Assistant:

void us_internal_timer_sweep(struct us_loop_t *loop) {
    struct us_internal_loop_data_t *loop_data = &loop->data;
    for (loop_data->iterator = loop_data->head; loop_data->iterator; loop_data->iterator = loop_data->iterator->next) {

        struct us_socket_context_t *context = loop_data->iterator;
        for (context->iterator = context->head; context->iterator; ) {

            struct us_socket_t *s = context->iterator;
            if (s->timeout && --(s->timeout) == 0) {

                context->on_socket_timeout(s);

                /* Check for unlink / link */
                if (s == context->iterator) {
                    context->iterator = s->next;
                }
            } else {
                context->iterator = s->next;
            }
        }
    }
}